

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void find_blending_regions(FIRSTPASS_STATS *stats,REGIONS *regions,int *num_regions)

{
  bool bVar1;
  REGIONS *pRVar2;
  int iVar3;
  int iVar4;
  int *in_RDX;
  REGIONS *in_RSI;
  FIRSTPASS_STATS *in_RDI;
  double dVar5;
  int prev_k;
  double prev_ratio;
  double max_coded_error_1;
  double max_coded_error;
  double ratio_thres_1;
  double last_ratio;
  double prev_length;
  int to_merge;
  int total_length;
  int next_dir_1;
  int prev_dir_1;
  double ratio_thres;
  int next_dir;
  int prev_dir;
  int this_dir;
  int large_change;
  double grad;
  int last;
  int start;
  int dir;
  int count_stable;
  int k;
  int i;
  REGIONS *in_stack_ffffffffffffff18;
  FIRSTPASS_STATS *in_stack_ffffffffffffff20;
  int *in_stack_ffffffffffffff28;
  FIRSTPASS_STATS *in_stack_ffffffffffffff30;
  REGIONS *in_stack_ffffffffffffff38;
  REGIONS *in_stack_ffffffffffffff40;
  REGIONS *in_stack_ffffffffffffff48;
  REGION_TYPES type;
  double in_stack_ffffffffffffff50;
  double local_a8;
  double local_78;
  double local_70;
  int local_40;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  local_20 = 0;
  local_24 = 0;
  while (local_20 < *in_RDX) {
    if (in_RSI[local_20].type == STABLE_REGION) {
      local_20 = local_20 + 1;
      local_24 = local_24 + 1;
    }
    else {
      local_28 = 0;
      local_1c = in_RSI[local_20].start;
      while( true ) {
        type = (REGION_TYPES)((ulong)in_stack_ffffffffffffff48 >> 0x20);
        iVar3 = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
        if (in_RSI[local_20].last < local_1c) break;
        if ((((local_20 != 0) || (local_1c != in_RSI->start)) && (in_RDI[local_1c].is_flash == 0))
           && ((local_1c < 1 || (in_RDI[local_1c + -1].is_flash == 0)))) {
          dVar5 = in_RDI[local_1c].intra_error - in_RDI[local_1c + -1].intra_error;
          if (in_RDI[local_1c].intra_error <= 0.01) {
            local_a8 = 0.01;
          }
          else {
            local_a8 = in_RDI[local_1c].intra_error;
          }
          local_40 = 0;
          if ((0.05 < ABS(dVar5) / local_a8) && (local_40 = -1, 0.0 < dVar5)) {
            local_40 = 1;
          }
          if (local_28 != local_40) {
            if (local_28 != 0) {
              insert_region(iVar3,SUB84(in_stack_ffffffffffffff50,0),type,in_stack_ffffffffffffff40,
                            &in_stack_ffffffffffffff38->start,(int *)in_stack_ffffffffffffff30);
            }
            local_28 = local_40;
          }
        }
        local_1c = local_1c + 1;
      }
      if (local_28 != 0) {
        insert_region(iVar3,SUB84(in_stack_ffffffffffffff50,0),type,in_stack_ffffffffffffff40,
                      &in_stack_ffffffffffffff38->start,(int *)in_stack_ffffffffffffff30);
      }
      local_20 = local_20 + 1;
    }
  }
  get_region_stats(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,0);
  for (local_20 = 0; local_20 < *in_RDX; local_20 = local_20 + 1) {
    if ((in_RSI[local_20].type == BLENDING_REGION) &&
       (((in_RSI[local_20].last == in_RSI[local_20].start ||
         (in_RSI[local_20].avg_cor_coeff <= 0.6 && in_RSI[local_20].avg_cor_coeff != 0.6)) ||
        (local_24 == 0)))) {
      in_RSI[local_20].type = HIGH_VAR_REGION;
    }
  }
  get_region_stats(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,0);
  local_20 = 1;
LAB_002bc676:
  do {
    if (*in_RDX <= local_20) {
      cleanup_regions((REGIONS *)in_stack_ffffffffffffff20,&in_stack_ffffffffffffff18->start);
      return;
    }
    if (((local_20 < *in_RDX + -1) && (in_RSI[local_20].type == HIGH_VAR_REGION)) &&
       ((in_RSI[local_20 + -1].type == BLENDING_REGION &&
        ((in_RSI[local_20 + 1].type == BLENDING_REGION &&
         (in_RSI[local_20].last - in_RSI[local_20].start < 3)))))) {
      iVar3 = -1;
      if (0.0 < in_RDI[in_RSI[local_20 + -1].last].intra_error -
                in_RDI[in_RSI[local_20 + -1].last + -1].intra_error) {
        iVar3 = 1;
      }
      iVar4 = -1;
      if (0.0 < in_RDI[in_RSI[local_20 + 1].last].intra_error -
                in_RDI[in_RSI[local_20 + 1].last + -1].intra_error) {
        iVar4 = 1;
      }
      if ((iVar3 < 0) && (0 < iVar4)) {
        if (in_RSI[local_20 + 1].avg_sr_fr_ratio <= in_RSI[local_20 + -1].avg_sr_fr_ratio) {
          in_stack_ffffffffffffff50 = in_RSI[local_20 + 1].avg_sr_fr_ratio;
        }
        else {
          in_stack_ffffffffffffff50 = in_RSI[local_20 + -1].avg_sr_fr_ratio;
        }
        if (in_stack_ffffffffffffff50 * 0.95 < in_RSI[local_20].avg_sr_fr_ratio) {
          in_RSI[local_20].type = BLENDING_REGION;
          remove_region((int)((ulong)in_stack_ffffffffffffff40 >> 0x20),in_stack_ffffffffffffff38,
                        (int *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
          analyze_region(in_RDI,local_20 + -1,in_RSI);
          goto LAB_002bc676;
        }
      }
    }
    if ((in_RSI[local_20 + -1].type == BLENDING_REGION) &&
       (in_RSI[local_20].type == BLENDING_REGION)) {
      iVar3 = -1;
      if (0.0 < in_RDI[in_RSI[local_20 + -1].last].intra_error -
                in_RDI[in_RSI[local_20 + -1].last + -1].intra_error) {
        iVar3 = 1;
      }
      iVar4 = -1;
      if (0.0 < in_RDI[in_RSI[local_20].last].intra_error -
                in_RDI[in_RSI[local_20].last + -1].intra_error) {
        iVar4 = 1;
      }
      if ((in_RSI[local_20].last - in_RSI[local_20 + -1].start) + 1 < 4) {
        in_RSI[local_20 + -1].type = HIGH_VAR_REGION;
        local_20 = local_20 + 1;
      }
      else {
        bVar1 = false;
        if ((iVar3 < 0) && (0 < iVar4)) {
          dVar5 = (double)((in_RSI[local_20 + -1].last - in_RSI[local_20 + -1].start) + 1);
          if (2.01 <= dVar5) {
            if (in_RDI[in_RSI[local_20 + -1].last].coded_error <
                in_RDI[in_RSI[local_20 + -1].last + -1].coded_error ||
                in_RDI[in_RSI[local_20 + -1].last].coded_error ==
                in_RDI[in_RSI[local_20 + -1].last + -1].coded_error) {
              in_stack_ffffffffffffff30 =
                   (FIRSTPASS_STATS *)in_RDI[in_RSI[local_20 + -1].last + -1].coded_error;
            }
            else {
              in_stack_ffffffffffffff30 =
                   (FIRSTPASS_STATS *)in_RDI[in_RSI[local_20 + -1].last].coded_error;
            }
            in_stack_ffffffffffffff28 = (int *)in_RDI[in_RSI[local_20 + -1].last].sr_coded_error;
            in_stack_ffffffffffffff20 = in_stack_ffffffffffffff30;
            if ((double)in_stack_ffffffffffffff30 <= 0.001) {
              in_stack_ffffffffffffff20 = (FIRSTPASS_STATS *)0x3f50624dd2f1a9fc;
            }
            local_70 = (double)in_stack_ffffffffffffff28 / (double)in_stack_ffffffffffffff20;
            in_stack_ffffffffffffff18 =
                 (REGIONS *)
                 ((in_RSI[local_20 + -1].avg_sr_fr_ratio * dVar5 + -local_70) / (dVar5 - 1.0));
            pRVar2 = in_stack_ffffffffffffff18;
            if (in_RSI[local_20].avg_sr_fr_ratio <= (double)in_stack_ffffffffffffff18) {
              in_stack_ffffffffffffff18 = (REGIONS *)in_RSI[local_20].avg_sr_fr_ratio;
              pRVar2 = in_stack_ffffffffffffff18;
            }
          }
          else {
            if (in_RDI[in_RSI[local_20 + -1].last].coded_error <
                in_RDI[in_RSI[local_20 + -1].last + -1].coded_error ||
                in_RDI[in_RSI[local_20 + -1].last].coded_error ==
                in_RDI[in_RSI[local_20 + -1].last + -1].coded_error) {
              in_stack_ffffffffffffff48 =
                   (REGIONS *)in_RDI[in_RSI[local_20 + -1].last + -1].coded_error;
            }
            else {
              in_stack_ffffffffffffff48 = (REGIONS *)in_RDI[in_RSI[local_20 + -1].last].coded_error;
            }
            in_stack_ffffffffffffff40 = (REGIONS *)in_RDI[in_RSI[local_20 + -1].last].sr_coded_error
            ;
            in_stack_ffffffffffffff38 = in_stack_ffffffffffffff48;
            if ((double)in_stack_ffffffffffffff48 <= 0.001) {
              in_stack_ffffffffffffff38 = (REGIONS *)0x3f50624dd2f1a9fc;
            }
            local_70 = (double)in_stack_ffffffffffffff40 / (double)in_stack_ffffffffffffff38;
            pRVar2 = (REGIONS *)in_RSI[local_20].avg_sr_fr_ratio;
          }
          local_78 = (double)pRVar2 * 0.95;
          bVar1 = local_78 < local_70;
        }
        if (!bVar1) {
          insert_region((int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                        SUB84(in_stack_ffffffffffffff50,0),
                        (REGION_TYPES)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                        in_stack_ffffffffffffff40,&in_stack_ffffffffffffff38->start,
                        (int *)in_stack_ffffffffffffff30);
          analyze_region(in_RDI,local_20 + -1,in_RSI);
          analyze_region(in_RDI,local_20,in_RSI);
          goto LAB_002bd157;
        }
        remove_region((int)((ulong)in_stack_ffffffffffffff40 >> 0x20),in_stack_ffffffffffffff38,
                      (int *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        analyze_region(in_RDI,local_20 + -1,in_RSI);
      }
    }
    else {
LAB_002bd157:
      local_20 = local_20 + 1;
    }
  } while( true );
}

Assistant:

static void find_blending_regions(const FIRSTPASS_STATS *stats,
                                  REGIONS *regions, int *num_regions) {
  int i, k = 0;
  // Blending regions will have large content change, therefore will have a
  // large consistent change in intra error.
  int count_stable = 0;
  while (k < *num_regions) {
    if (regions[k].type == STABLE_REGION) {
      k++;
      count_stable++;
      continue;
    }
    int dir = 0;
    int start = 0, last;
    for (i = regions[k].start; i <= regions[k].last; i++) {
      // First mark the regions that has consistent large change of intra error.
      if (k == 0 && i == regions[k].start) continue;
      if (stats[i].is_flash || (i > 0 && stats[i - 1].is_flash)) continue;
      double grad = stats[i].intra_error - stats[i - 1].intra_error;
      int large_change = fabs(grad) / AOMMAX(stats[i].intra_error, 0.01) > 0.05;
      int this_dir = 0;
      if (large_change) {
        this_dir = (grad > 0) ? 1 : -1;
      }
      // the current trend continues
      if (dir == this_dir) continue;
      if (dir != 0) {
        // Mark the end of a new large change group and add it
        last = i - 1;
        insert_region(start, last, BLENDING_REGION, regions, num_regions, &k);
      }
      dir = this_dir;
      if (k == 0 && i == regions[k].start + 1) {
        start = i - 1;
      } else {
        start = i;
      }
    }
    if (dir != 0) {
      last = regions[k].last;
      insert_region(start, last, BLENDING_REGION, regions, num_regions, &k);
    }
    k++;
  }

  // If the blending region has very low correlation, mark it as high variance
  // since we probably cannot benefit from it anyways.
  get_region_stats(stats, regions, *num_regions);
  for (k = 0; k < *num_regions; k++) {
    if (regions[k].type != BLENDING_REGION) continue;
    if (regions[k].last == regions[k].start || regions[k].avg_cor_coeff < 0.6 ||
        count_stable == 0)
      regions[k].type = HIGH_VAR_REGION;
  }
  get_region_stats(stats, regions, *num_regions);

  // It is possible for blending to result in a "dip" in intra error (first
  // decrease then increase). Therefore we need to find the dip and combine the
  // two regions.
  k = 1;
  while (k < *num_regions) {
    if (k < *num_regions - 1 && regions[k].type == HIGH_VAR_REGION) {
      // Check if this short high variance regions is actually in the middle of
      // a blending region.
      if (regions[k - 1].type == BLENDING_REGION &&
          regions[k + 1].type == BLENDING_REGION &&
          regions[k].last - regions[k].start < 3) {
        int prev_dir = (stats[regions[k - 1].last].intra_error -
                        stats[regions[k - 1].last - 1].intra_error) > 0
                           ? 1
                           : -1;
        int next_dir = (stats[regions[k + 1].last].intra_error -
                        stats[regions[k + 1].last - 1].intra_error) > 0
                           ? 1
                           : -1;
        if (prev_dir < 0 && next_dir > 0) {
          // This is possibly a mid region of blending. Check the ratios
          double ratio_thres = AOMMIN(regions[k - 1].avg_sr_fr_ratio,
                                      regions[k + 1].avg_sr_fr_ratio) *
                               0.95;
          if (regions[k].avg_sr_fr_ratio > ratio_thres) {
            regions[k].type = BLENDING_REGION;
            remove_region(2, regions, num_regions, &k);
            analyze_region(stats, k - 1, regions);
            continue;
          }
        }
      }
    }
    // Check if we have a pair of consecutive blending regions.
    if (regions[k - 1].type == BLENDING_REGION &&
        regions[k].type == BLENDING_REGION) {
      int prev_dir = (stats[regions[k - 1].last].intra_error -
                      stats[regions[k - 1].last - 1].intra_error) > 0
                         ? 1
                         : -1;
      int next_dir = (stats[regions[k].last].intra_error -
                      stats[regions[k].last - 1].intra_error) > 0
                         ? 1
                         : -1;

      // if both are too short, no need to check
      int total_length = regions[k].last - regions[k - 1].start + 1;
      if (total_length < 4) {
        regions[k - 1].type = HIGH_VAR_REGION;
        k++;
        continue;
      }

      int to_merge = 0;
      if (prev_dir < 0 && next_dir > 0) {
        // In this case we check the last frame in the previous region.
        double prev_length =
            (double)(regions[k - 1].last - regions[k - 1].start + 1);
        double last_ratio, ratio_thres;
        if (prev_length < 2.01) {
          // if the previous region is very short
          double max_coded_error =
              AOMMAX(stats[regions[k - 1].last].coded_error,
                     stats[regions[k - 1].last - 1].coded_error);
          last_ratio = stats[regions[k - 1].last].sr_coded_error /
                       AOMMAX(max_coded_error, 0.001);
          ratio_thres = regions[k].avg_sr_fr_ratio * 0.95;
        } else {
          double max_coded_error =
              AOMMAX(stats[regions[k - 1].last].coded_error,
                     stats[regions[k - 1].last - 1].coded_error);
          last_ratio = stats[regions[k - 1].last].sr_coded_error /
                       AOMMAX(max_coded_error, 0.001);
          double prev_ratio =
              (regions[k - 1].avg_sr_fr_ratio * prev_length - last_ratio) /
              (prev_length - 1.0);
          ratio_thres = AOMMIN(prev_ratio, regions[k].avg_sr_fr_ratio) * 0.95;
        }
        if (last_ratio > ratio_thres) {
          to_merge = 1;
        }
      }

      if (to_merge) {
        remove_region(0, regions, num_regions, &k);
        analyze_region(stats, k - 1, regions);
        continue;
      } else {
        // These are possibly two separate blending regions. Mark the boundary
        // frame as HIGH_VAR_REGION to separate the two.
        int prev_k = k - 1;
        insert_region(regions[prev_k].last, regions[prev_k].last,
                      HIGH_VAR_REGION, regions, num_regions, &prev_k);
        analyze_region(stats, prev_k, regions);
        k = prev_k + 1;
        analyze_region(stats, k, regions);
      }
    }
    k++;
  }
  cleanup_regions(regions, num_regions);
}